

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O0

void matras_alloc_overflow_test(void)

{
  void *pvVar1;
  void *data;
  size_t i;
  matras mat;
  matras_id_t id;
  size_t max_capacity;
  
  _space(_stdout);
  printf("# *** %s ***\n","matras_alloc_overflow_test");
  plan(2);
  matras_create((matras *)&i,0x10,&pta_allocator,(matras_stats *)0x0);
  data = (void *)0x0;
  while( true ) {
    if ((void *)0xff < data) {
      pvVar1 = matras_alloc((matras *)&i,(matras_id_t *)((long)&mat.stats + 4));
      _ok((uint)(pvVar1 == (void *)0x0),"matras_alloc(&mat, &id) == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x156
          ,"line %d");
      _ok((uint)(mat.stats._4_4_ == 0xff),"id == max_capacity - 1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x157
          ,"line %d");
      matras_destroy((matras *)&i);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_alloc_overflow_test");
      check_plan();
      return;
    }
    pvVar1 = matras_alloc((matras *)&i,(matras_id_t *)((long)&mat.stats + 4));
    if (pvVar1 == (void *)0x0) break;
    if ((void *)(ulong)mat.stats._4_4_ != data) {
      fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","id == i","false",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
              0x153,"matras_alloc_overflow_test");
      exit(-1);
    }
    data = (void *)((long)data + 1);
  }
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","data != NULL","false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x152
          ,"matras_alloc_overflow_test");
  exit(-1);
}

Assistant:

void
matras_alloc_overflow_test()
{
	header();
	plan(2);

	size_t max_capacity = PROV_EXTENT_SIZE / PROV_BLOCK_SIZE;
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);

	matras_id_t id;
	struct matras mat;
	matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);
	for (size_t i = 0; i < max_capacity; i++) {
		void *data = matras_alloc(&mat, &id);
		fail_unless(data != NULL);
		fail_unless(id == i);
	}
	/* Try to exceed the maximum capacity. */
	ok(matras_alloc(&mat, &id) == NULL);
	ok(id == max_capacity - 1);
	matras_destroy(&mat);

	footer();
	check_plan();
}